

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O1

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>
          *this)

{
  size_type *this_00;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_01;
  iterator __position;
  node_ptr plVar1;
  __node_base_ptr p_Var2;
  undefined1 *puVar3;
  pointer pPVar4;
  pointer pvVar5;
  int iVar6;
  mapped_type *pmVar7;
  Delete_disposer DVar8;
  _Hash_node_base *p_Var9;
  __node_base_ptr p_Var10;
  ulong uVar11;
  pointer pPVar12;
  ulong uVar13;
  uint uVar14;
  __node_base_ptr p_Var15;
  long lVar16;
  Column_support *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer this_03;
  float *pfVar17;
  Index i;
  int dim;
  Index pivotColumnNumber;
  Pos_index nullDeath;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  float local_bc;
  anon_class_8_1_e4bd5e45 local_b8;
  int local_b0;
  uint local_ac;
  anon_class_1_0_00000001 local_a8;
  anon_class_1_0_00000001 local_a7;
  anon_class_1_0_00000001 local_a6;
  anon_class_1_0_00000001 local_a5;
  uint local_a4;
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  *local_a0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_78;
  float *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_a4 = 0xffffffff;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,
               (ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor,
               (hash<unsigned_int> *)&local_98,(key_equal *)&local_b8,(allocator_type *)&local_b0);
  local_b0 = *(int *)&this[-1].isReduced_;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_98,(long)local_b0 + 1,(allocator_type *)&local_b8);
  pvVar5 = local_98.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_03 = local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_03 != pvVar5; this_03 = this_03 + 1
      ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_03,(ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
              );
  }
  local_bc = 0.0;
  if (this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor != 0.0) {
    do {
      lVar16 = (long)local_b0;
      local_b8.targetColumn._0_4_ = local_bc;
      pmVar7 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     *)&this[1].super_type.map_._M_h._M_bucket_count,(key_type *)&local_b8);
      this_01 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                (local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                (lVar16 - (pmVar7->super_Column_dimension_option).dim_));
      __position._M_current = *(uint **)(this_01 + 8);
      if (__position._M_current == *(uint **)(this_01 + 0x10)) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>(this_01,__position,(uint *)&local_bc);
      }
      else {
        *__position._M_current = (uint)local_bc;
        *(uint **)(this_01 + 8) = __position._M_current + 1;
      }
      local_bc = (float)((int)local_bc + 1);
    } while ((uint)local_bc < (uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
            );
  }
  local_80 = local_98.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    this_00 = &this[1].super_type.map_._M_h._M_bucket_count;
    local_a0 = (vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
                *)&this->barcode_;
    do {
      pfVar17 = (float *)((local_98.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
      local_70 = (float *)((local_98.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
      local_78 = local_98.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if (pfVar17 != local_70) {
        do {
          local_bc = *pfVar17;
          local_b8.targetColumn._0_4_ = local_bc;
          DVar8.col_ = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_b8);
          this_02 = &(DVar8.col_)->column_;
          plVar1 = ((DVar8.col_)->column_).super_type.data_.root_plus_size_.m_header.super_node.
                   next_;
          if (plVar1 == (node_ptr)0x0 || plVar1 == (node_ptr)this_02) {
            p_Var2 = local_68._M_buckets[(ulong)(uint)local_bc % local_68._M_bucket_count];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var15 = p_Var2->_M_nxt,
               local_bc != *(float *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)(uint)*(float *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)(uint)local_bc % local_68._M_bucket_count) ||
                   (p_Var10 = p_Var15, p_Var15 = p_Var9, local_bc == *(float *)&p_Var9[1]._M_nxt))
                goto LAB_00172235;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_00172235:
            if ((p_Var10 == (__node_base_ptr)0x0) || (p_Var10->_M_nxt == (_Hash_node_base *)0x0)) {
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_a0,(uint *)&local_bc,&local_a4,&local_b0);
            }
          }
          else {
            uVar14 = *(uint *)&((DVar8.col_)->column_).super_type.data_.root_plus_size_.m_header.
                               super_node.prev_[1].next_;
            uVar11 = (this->idToPosition_)._M_h._M_bucket_count;
            uVar13 = (ulong)uVar14 % uVar11;
            p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar13];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var15 = p_Var2->_M_nxt,
               uVar14 != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar11 != uVar13) ||
                   (p_Var10 = p_Var15, p_Var15 = p_Var9, uVar14 == *(uint *)&p_Var9[1]._M_nxt))
                goto LAB_00172264;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_00172264:
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var9 = p_Var10->_M_nxt;
            }
            local_ac = uVar14;
            if (p_Var9 != (_Hash_node_base *)0x0) {
              local_ac = *(uint *)((long)&p_Var9[1]._M_nxt + 4);
            }
            p_Var2 = local_68._M_buckets[(ulong)local_ac % local_68._M_bucket_count];
            p_Var10 = (__node_base_ptr)0x0;
            if ((p_Var2 != (__node_base_ptr)0x0) &&
               (p_Var10 = p_Var2, p_Var15 = p_Var2->_M_nxt,
               local_ac != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
              while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                p_Var10 = (__node_base_ptr)0x0;
                if (((ulong)*(uint *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                     (ulong)local_ac % local_68._M_bucket_count) ||
                   (p_Var10 = p_Var15, p_Var15 = p_Var9, local_ac == *(uint *)&p_Var9[1]._M_nxt))
                goto LAB_001722dd;
              }
              p_Var10 = (__node_base_ptr)0x0;
            }
LAB_001722dd:
            if (p_Var10 == (__node_base_ptr)0x0) {
              p_Var9 = (_Hash_node_base *)0x0;
            }
            else {
              p_Var9 = p_Var10->_M_nxt;
            }
            if (p_Var9 == (_Hash_node_base *)0x0) {
              iVar6 = -1;
            }
            else {
              iVar6 = *(int *)((long)&p_Var9[1]._M_nxt + 4);
            }
            while ((uVar14 != 0xffffffff && (iVar6 != -1))) {
              local_b8.targetColumn._0_4_ = (float)iVar6;
              pmVar7 = std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,(key_type *)&local_b8);
              local_b8.targetColumn = DVar8.col_;
              _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)___::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pmVar7,DVar8.col_,&local_a5,&local_b8,&local_a6,&local_a7,&local_a8);
              puVar3 = (undefined1 *)
                       (this_02->super_type).data_.root_plus_size_.m_header.super_node.next_;
              uVar14 = 0xffffffff;
              if ((Column_support *)puVar3 != this_02 && puVar3 != (undefined1 *)0x0) {
                uVar14 = *(uint *)&((DVar8.col_)->column_).super_type.data_.root_plus_size_.m_header
                                   .super_node.prev_[1].next_;
              }
              uVar11 = (this->idToPosition_)._M_h._M_bucket_count;
              uVar13 = (ulong)uVar14 % uVar11;
              p_Var2 = (this->idToPosition_)._M_h._M_buckets[uVar13];
              p_Var10 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var10 = p_Var2, p_Var15 = p_Var2->_M_nxt,
                 uVar14 != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar11 != uVar13) ||
                     (p_Var10 = p_Var15, p_Var15 = p_Var9, uVar14 == *(uint *)&p_Var9[1]._M_nxt))
                  goto LAB_001723c5;
                }
                p_Var10 = (__node_base_ptr)0x0;
              }
LAB_001723c5:
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var9 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var9 = p_Var10->_M_nxt;
              }
              local_ac = uVar14;
              if (p_Var9 != (_Hash_node_base *)0x0) {
                local_ac = *(uint *)((long)&p_Var9[1]._M_nxt + 4);
              }
              p_Var2 = local_68._M_buckets[(ulong)local_ac % local_68._M_bucket_count];
              p_Var10 = (__node_base_ptr)0x0;
              if ((p_Var2 != (__node_base_ptr)0x0) &&
                 (p_Var10 = p_Var2, p_Var15 = p_Var2->_M_nxt,
                 local_ac != *(uint *)&p_Var2->_M_nxt[1]._M_nxt)) {
                while (p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
                  p_Var10 = (__node_base_ptr)0x0;
                  if (((ulong)*(uint *)&p_Var9[1]._M_nxt % local_68._M_bucket_count !=
                       (ulong)local_ac % local_68._M_bucket_count) ||
                     (p_Var10 = p_Var15, p_Var15 = p_Var9, local_ac == *(uint *)&p_Var9[1]._M_nxt))
                  goto LAB_0017243e;
                }
                p_Var10 = (__node_base_ptr)0x0;
              }
LAB_0017243e:
              if (p_Var10 == (__node_base_ptr)0x0) {
                p_Var9 = (_Hash_node_base *)0x0;
              }
              else {
                p_Var9 = p_Var10->_M_nxt;
              }
              if (p_Var9 == (_Hash_node_base *)0x0) {
                iVar6 = -1;
              }
              else {
                iVar6 = *(int *)((long)&p_Var9[1]._M_nxt + 4);
              }
            }
            if (uVar14 != 0xffffffff) {
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<unsigned_int&,unsigned_int&>
                        ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)&local_68,&local_ac,&local_bc);
              local_b8.targetColumn._0_4_ = (float)local_ac;
              DVar8.col_ = std::__detail::
                           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this_00,(key_type *)&local_b8);
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)&(DVar8.col_)->column_,DVar8);
              local_b8.targetColumn._0_4_ = (float)(local_b0 + -1);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int&,int>
                        (local_a0,&local_ac,(uint *)&local_bc,(int *)&local_b8);
            }
            else {
              boost::intrusive::
              list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              ::
              clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::Delete_disposer>
                        ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
                          *)this_02,DVar8);
              std::
              vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              ::emplace_back<unsigned_int&,unsigned_int_const&,int&>
                        (local_a0,(uint *)&local_bc,&local_a4,&local_b0);
            }
          }
          pfVar17 = pfVar17 + 1;
        } while (pfVar17 != local_70);
      }
      local_b0 = local_b0 + -1;
      local_98.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_78 + 1;
    } while (local_98.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start != local_80);
  }
  pPVar12 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar4 = (this->barcode_).
           super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pPVar12 != pPVar4) {
    uVar11 = ((long)pPVar4 - (long)pPVar12 >> 2) * -0x5555555555555555;
    lVar16 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar12,pPVar4,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,false,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
              (pPVar12,pPVar4);
  }
  local_b8.targetColumn = local_b8.targetColumn & 0xffffffff00000000;
  pPVar12 = (this->barcode_).
            super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->barcode_).
      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pPVar12) {
    uVar11 = 0;
    do {
      local_bc = (float)pPVar12[uVar11].death;
      if (local_bc != -NAN) {
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&this->deathToBar_,&local_bc,&local_b8);
      }
      uVar11 = (ulong)((int)local_b8.targetColumn._0_4_ + 1U);
      local_b8.targetColumn._0_4_ = (float)((int)local_b8.targetColumn._0_4_ + 1U);
      pPVar12 = (this->barcode_).
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(this->barcode_).
                      super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar12 >> 2) *
               -0x5555555555555555;
    } while (uVar11 <= uVar13 && uVar13 - uVar11 != 0);
  }
  this->isReduced_ = true;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_98);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}